

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGPUShader5Tests.cpp
# Opt level: O0

void __thiscall
gl3cts::GPUShader5ImplicitConversionsTest::deinit(GPUShader5ImplicitConversionsTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Functions *gl_2;
  Functions *gl_1;
  Functions *gl;
  GPUShader5ImplicitConversionsTest *this_local;
  
  if (this->m_fbo_id != 0) {
    pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  if (this->m_tex_id != 0) {
    pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x480))(1,&this->m_tex_id);
    this->m_tex_id = 0;
  }
  if (this->m_vao_id != 0) {
    pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  return;
}

Assistant:

void GPUShader5ImplicitConversionsTest::deinit()
{
	if (m_fbo_id != 0)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();
		gl.deleteFramebuffers(1, &m_fbo_id);

		m_fbo_id = 0;
	}

	if (m_tex_id != 0)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();
		gl.deleteTextures(1, &m_tex_id);

		m_tex_id = 0;
	}

	if (m_vao_id != 0)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}
}